

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeleteMessage.cpp
# Opt level: O2

string * __thiscall
DeleteMessage::execute_abi_cxx11_(string *__return_storage_ptr__,DeleteMessage *this)

{
  int iVar1;
  int iVar2;
  DIR *__dirp;
  dirent *pdVar3;
  int iVar4;
  allocator local_a9;
  string *local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  char *local_80;
  char *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string dir;
  
  std::__cxx11::string::string
            ((string *)&local_70,(this->super_ServerOperation).MESSAGEDIR,&local_a9);
  std::operator+(&local_a0,&local_70,"/");
  std::operator+(&dir,&local_a0,&this->username);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_70);
  __dirp = opendir(dir._M_dataplus._M_p);
  if (__dirp == (DIR *)0x0) {
    std::__cxx11::string::assign((char *)&(this->super_ServerOperation).statusMessage);
    closedir((DIR *)0x0);
    std::operator+(&local_a0,"No such User \"",&this->username);
    std::operator+(__return_storage_ptr__,&local_a0,"\" found\n");
    std::__cxx11::string::~string((string *)&local_a0);
  }
  else {
    local_78 = (this->super_ServerOperation).FAILURE;
    local_a8 = &(this->super_ServerOperation).statusMessage;
    local_80 = (this->super_ServerOperation).SUCCESS;
    iVar2 = 1;
    iVar4 = 0;
    while ((pdVar3 = readdir(__dirp), pdVar3 != (dirent *)0x0 &&
           (iVar1 = this->chosen_message, iVar4 <= iVar1))) {
      if ((pdVar3->d_type == '\b') && (iVar4 = iVar4 + 1, iVar4 == iVar1)) {
        std::__cxx11::string::string((string *)&local_70,pdVar3->d_name,&local_a9);
        std::operator+(&local_a0,"/",&local_70);
        std::__cxx11::string::append((string *)&dir);
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_70);
        iVar2 = remove(dir._M_dataplus._M_p);
        iVar4 = iVar1;
        if (iVar2 == 0) {
          iVar2 = 0;
          std::__cxx11::string::assign((char *)local_a8);
        }
        else {
          std::__cxx11::string::assign((char *)local_a8);
        }
      }
    }
    if (iVar2 == 0) {
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"Message deleted",(allocator *)&local_a0);
    }
    else {
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"Delete not successful",(allocator *)&local_a0);
    }
  }
  std::__cxx11::string::~string((string *)&dir);
  return __return_storage_ptr__;
}

Assistant:

string DeleteMessage::execute() {
    int count = 0;
    int delete_result = 1;
    ///create and parse a path to the correct user directory
    string dir = string(MESSAGEDIR) + "/" + username;

    ///open the user directory with the input path
    DIR* userDir = opendir(dir.c_str()); //Open User Directory

    struct dirent * userDirEntry; //individual entries in the directory.

    ///if no directory found return 0
    if(userDir == nullptr){
        statusMessage = FAILURE;
        closedir(userDir);
        return "No such User \"" + username + "\" found\n";
    }

    ///while directory isn't empty or didn't reach right file keep looking:
    while ((userDirEntry = readdir(userDir)) != nullptr && count <= chosen_message) {
        ///check if the file is a regular type
        if (userDirEntry->d_type == DT_REG) {
            //count as countable file
            count++;
            if (count == chosen_message) {
                //deleting if reached correct file
                dir += "/" + string(userDirEntry->d_name);
                delete_result = remove(dir.c_str());
                ///check if remove function returned 0 for success or other code for failure
                if(delete_result == 0){
                    statusMessage = SUCCESS;
                }else{
                    statusMessage = FAILURE;
                }
            }
        }
    }

    ///return the correct string to give user the information about success or failure
    if(delete_result == 0){
        return "Message deleted";
    }else{
        return "Delete not successful";
    }
}